

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 VmHttpPorcessCookie(jx9_vm *pVm,SyBlob *pWorker,char *zIn,sxu32 nByte)

{
  sxu32 nKeylen;
  uint uVar1;
  char *pcVar2;
  jx9_value *pjVar3;
  ushort **ppuVar4;
  char *zSrc;
  bool bVar5;
  sxu32 nOfft;
  jx9_value *pCookie;
  SyString sValue;
  SyString sName;
  char *zEnd;
  char *zDelimiter;
  char *zPtr;
  char *pcStack_28;
  sxu32 nByte_local;
  char *zIn_local;
  SyBlob *pWorker_local;
  jx9_vm *pVm_local;
  
  pcVar2 = zIn + nByte;
  pjVar3 = VmExtractSuper(pVm,"_COOKIE",7);
  if ((pjVar3 == (jx9_value *)0x0) || (pcStack_28 = zIn, (pjVar3->iFlags & 0x40U) == 0)) {
    pVm_local._4_4_ = -6;
  }
  else {
    while( true ) {
      while( true ) {
        bVar5 = false;
        if (pcStack_28 < pcVar2) {
          ppuVar4 = __ctype_b_loc();
          bVar5 = ((*ppuVar4)[(int)*pcStack_28] & 0x2000) != 0;
        }
        if (!bVar5) break;
        pcStack_28 = pcStack_28 + 1;
      }
      if (pcVar2 <= pcStack_28) break;
      SyBlobReset(pWorker);
      zEnd = pcStack_28;
      while( true ) {
        bVar5 = false;
        if (zEnd < pcVar2) {
          bVar5 = *zEnd != ';';
        }
        if (!bVar5) break;
        zEnd = zEnd + 1;
      }
      zDelimiter = pcStack_28;
      while( true ) {
        bVar5 = false;
        if (zDelimiter < zEnd) {
          bVar5 = *zDelimiter != '=';
        }
        if (!bVar5) break;
        zDelimiter = zDelimiter + 1;
      }
      SyUriDecode(pcStack_28,(int)zDelimiter - (int)pcStack_28,jx9VmBlobConsumer,pWorker,1);
      nKeylen = pWorker->nByte;
      zSrc = zDelimiter + 1;
      pCookie = (jx9_value *)0x0;
      sValue.zString._0_4_ = 0;
      if (zSrc < zEnd) {
        uVar1 = pWorker->nByte;
        SyUriDecode(zSrc,(int)zEnd - (int)zSrc,jx9VmBlobConsumer,pWorker,1);
        pCookie = (jx9_value *)((long)pWorker->pBlob + (ulong)uVar1);
        sValue.zString._0_4_ = pWorker->nByte - uVar1;
      }
      pcStack_28 = zEnd + 1;
      VmHashmapInsert((jx9_hashmap *)(pjVar3->x).pOther,(char *)pWorker->pBlob,nKeylen,
                      (char *)pCookie,(int)sValue.zString);
    }
    pVm_local._4_4_ = 0;
  }
  return pVm_local._4_4_;
}

Assistant:

static sxi32 VmHttpPorcessCookie(jx9_vm *pVm, SyBlob *pWorker, const char *zIn, sxu32 nByte)
 {
	 const char *zPtr, *zDelimiter, *zEnd = &zIn[nByte];
	 SyString sName, sValue;
	 jx9_value *pCookie;
	 sxu32 nOfft;
	 /* Make sure the $_COOKIE superglobal is available */
	 pCookie = VmExtractSuper(&(*pVm), "_COOKIE", sizeof("_COOKIE")-1);
	 if( pCookie == 0 || (pCookie->iFlags & MEMOBJ_HASHMAP) == 0 ){
		 /* $_COOKIE superglobal not available */
		 return SXERR_NOTFOUND;
	 }	
	 for(;;){
		  /* Jump leading white spaces */
		 while( zIn < zEnd && SyisSpace(zIn[0]) ){
			 zIn++;
		 }
		 if( zIn >= zEnd ){
			 break;
		 }
		  /* Reset the working buffer */
		 SyBlobReset(pWorker);
		 zDelimiter = zIn;
		 /* Delimit the name[=value]; pair */ 
		 while( zDelimiter < zEnd && zDelimiter[0] != ';' ){
			 zDelimiter++;
		 }
		 zPtr = zIn;
		 while( zPtr < zDelimiter && zPtr[0] != '=' ){
			 zPtr++;
		 }
		 /* Decode the cookie */
		 SyUriDecode(zIn, (sxu32)(zPtr-zIn), jx9VmBlobConsumer, pWorker, TRUE);
		 sName.nByte = SyBlobLength(pWorker);
		 zPtr++;
		 sValue.zString = 0;
		 sValue.nByte = 0;
		 if( zPtr < zDelimiter ){
			 /* Got a Cookie value */
			 nOfft = SyBlobLength(pWorker);
			 SyUriDecode(zPtr, (sxu32)(zDelimiter-zPtr), jx9VmBlobConsumer, pWorker, TRUE);
			 SyStringInitFromBuf(&sValue, SyBlobDataAt(pWorker, nOfft), SyBlobLength(pWorker)-nOfft);
		 }
		 /* Synchronize pointers */
		 zIn = &zDelimiter[1];
		 /* Perform the insertion */
		 sName.zString = (const char *)SyBlobData(pWorker);
		 VmHashmapInsert((jx9_hashmap *)pCookie->x.pOther, 
			 sName.zString, (int)sName.nByte, 
			 sValue.zString, (int)sValue.nByte
			 );
	 }
	 return SXRET_OK;
 }